

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::sendCommand(OledI2C *this,uint8_t command,uint8_t value)

{
  int __fd;
  pointer __buf;
  size_type __n;
  ssize_t sVar1;
  undefined8 uVar2;
  uchar in_DL;
  uchar in_SIL;
  long in_RDI;
  string what;
  array<unsigned_char,_3UL> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_70 [12];
  int in_stack_ffffffffffffff9c;
  string local_50 [40];
  string *in_stack_ffffffffffffffd8;
  error_category *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  uint3 in_stack_fffffffffffffff0;
  uint uVar3;
  uchar uVar4;
  uchar uVar5;
  
  uVar3 = (uint)in_stack_fffffffffffffff0;
  uVar4 = in_DL;
  uVar5 = in_SIL;
  __fd = FileDescriptor::fd((FileDescriptor *)(in_RDI + 0x10));
  __buf = std::array<unsigned_char,_3UL>::data((array<unsigned_char,_3UL> *)0x10be98);
  __n = std::array<unsigned_char,_3UL>::size((array<unsigned_char,_3UL> *)&stack0xfffffffffffffff3);
  sVar1 = write(__fd,__buf,__n);
  if (sVar1 == -1) {
    std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    std::operator+((char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    uVar2 = __cxa_allocate_exception(0x20);
    __errno_location();
    std::_V2::system_category();
    std::system_error::system_error
              ((system_error *)
               CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(in_DL,CONCAT14(in_SIL,uVar3)))),
               in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::sendCommand(
    uint8_t command,
    uint8_t value) const
{
    std::array<uint8_t, 3> data{OLED_COMMAND, command, value};

    if (::write(fd_.fd(), data.data(), data.size()) == -1)
    {
        std::string what( "write " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }
}